

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

ssize_t __thiscall uS::Socket::write(Socket *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  uv_os_sock_t __fd_00;
  SocketData *pSVar3;
  SocketData *pSVar4;
  undefined4 in_register_00000034;
  Message *message;
  SocketData *socketData;
  ssize_t sent;
  Socket *pSVar5;
  undefined1 local_1;
  
  message = (Message *)CONCAT44(in_register_00000034,__fd);
  pSVar3 = getSocketData(this);
  bVar1 = SocketData::Queue::empty(&pSVar3->messageQueue);
  if (bVar1) {
    if (pSVar3->ssl == (SSL *)0x0) {
      __fd_00 = getFd(this);
      pSVar4 = (SocketData *)send(__fd_00,message->data,message->length,0x4000);
      if (pSVar4 == (SocketData *)message->length) {
        *(undefined1 *)&((Socket *)__buf)->p = 0;
        local_1 = 1;
        goto LAB_00134d08;
      }
      pSVar5 = (Socket *)__buf;
      if (pSVar4 == (SocketData *)0xffffffffffffffff) {
        __buf = __errno_location();
        if (*(int *)&((Socket *)__buf)->p != 0xb) {
          local_1 = 0;
          goto LAB_00134d08;
        }
      }
      else {
        message->length = message->length - (long)pSVar4;
        message->data = (char *)((long)&pSVar4->nodeData + (long)message->data);
      }
      __buf = pSVar5;
      if ((pSVar3->poll & 2U) == 0) {
        pSVar3->poll = pSVar3->poll | 2;
        changePoll(pSVar5,pSVar4);
        __buf = pSVar5;
      }
    }
    else {
      iVar2 = SSL_write((SSL *)pSVar3->ssl,message->data,(int)message->length);
      pSVar4 = (SocketData *)(long)iVar2;
      if (pSVar4 == (SocketData *)message->length) {
        *(undefined1 *)&((Socket *)__buf)->p = 0;
        local_1 = 1;
        goto LAB_00134d08;
      }
      if (((long)pSVar4 < 0) &&
         (pSVar5 = (Socket *)__buf, iVar2 = SSL_get_error((SSL *)pSVar3->ssl,iVar2), __buf = pSVar5,
         iVar2 != 2)) {
        __buf = (void *)(ulong)(iVar2 - 3U);
        if (iVar2 - 3U != 0) {
          local_1 = 0;
          goto LAB_00134d08;
        }
        __buf = pSVar5;
        if ((pSVar3->poll & 2U) == 0) {
          pSVar3->poll = pSVar3->poll | 2;
          changePoll(pSVar5,pSVar4);
          __buf = pSVar5;
        }
      }
    }
  }
  SocketData::Queue::push(&pSVar3->messageQueue,message);
  *(undefined1 *)&((Socket *)__buf)->p = 1;
  local_1 = 1;
LAB_00134d08:
  return CONCAT71((int7)((ulong)__buf >> 8),local_1);
}

Assistant:

bool write(SocketData::Queue::Message *message, bool &wasTransferred) {
        ssize_t sent = 0;
        SocketData *socketData = getSocketData();
        if (socketData->messageQueue.empty()) {

            if (socketData->ssl) {
                sent = SSL_write(socketData->ssl, message->data, message->length);
                if (sent == (ssize_t) message->length) {
                    wasTransferred = false;
                    return true;
                } else if (sent < 0) {
                    switch (SSL_get_error(socketData->ssl, sent)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            changePoll(socketData);
                        }
                        break;
                    default:
                        return false;
                    }
                }
            } else {
                sent = ::send(getFd(), message->data, message->length, MSG_NOSIGNAL);
                if (sent == (ssize_t) message->length) {
                    wasTransferred = false;
                    return true;
                } else if (sent == SOCKET_ERROR) {
                    if (errno != EWOULDBLOCK) {
                        return false;
                    }
                } else {
                    message->length -= sent;
                    message->data += sent;
                }

                if ((socketData->poll & UV_WRITABLE) == 0) {
                    socketData->poll |= UV_WRITABLE;
                    changePoll(socketData);
                }
            }
        }
        socketData->messageQueue.push(message);
        wasTransferred = true;
        return true;
    }